

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

timestamp_t duckdb::MakeTimestampOperator::Operation<long,duckdb::timestamp_t>(long value)

{
  ConversionException *this;
  string local_40;
  
  if ((value != 0x7fffffffffffffff) && (value != -0x7fffffffffffffff)) {
    return (timestamp_t)value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Timestamp microseconds out of range: %ld","");
  ConversionException::ConversionException<long>(this,&local_40,value);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(T value) {
		const auto result = RESULT_TYPE(value);
		if (!Timestamp::IsFinite(result)) {
			throw ConversionException("Timestamp microseconds out of range: %ld", value);
		}
		return RESULT_TYPE(value);
	}